

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaTypeFixupWhitespace(xmlSchemaTypePtr type)

{
  int iVar1;
  xmlSchemaFacetLinkPtr pxVar2;
  uint uVar3;
  xmlSchemaTypePtr pxVar4;
  uint uVar5;
  xmlSchemaFacetPtr pxVar6;
  bool bVar7;
  
  uVar3 = type->flags;
  if ((uVar3 & 0x40) == 0) {
    if ((char)uVar3 < '\0') {
      return 0;
    }
    pxVar2 = type->facetSet;
    pxVar4 = type;
    if (pxVar2 != (xmlSchemaFacetLinkPtr)0x0) {
      pxVar6 = pxVar2->facet;
      if (pxVar6->type == XML_SCHEMA_FACET_WHITESPACE) {
        bVar7 = false;
      }
      else {
        do {
          pxVar2 = pxVar2->next;
          bVar7 = pxVar2 == (_xmlSchemaFacetLink *)0x0;
          if (bVar7) goto LAB_001c128b;
          pxVar6 = pxVar2->facet;
        } while (pxVar6->type != XML_SCHEMA_FACET_WHITESPACE);
      }
      uVar5 = pxVar6->whitespace - 1;
      pxVar2 = (_xmlSchemaFacetLink *)0xffffffff;
      if (uVar5 < 3) {
        type->flags = uVar3 | *(uint *)(&DAT_001fb36c + (ulong)uVar5 * 4);
        pxVar2 = (_xmlSchemaFacetLink *)0x0;
      }
LAB_001c128b:
      if (!bVar7) {
        return (int)pxVar2;
      }
    }
    do {
      pxVar4 = pxVar4->baseType;
      if (pxVar4 == (xmlSchemaTypePtr)0x0) {
        return 0;
      }
      iVar1 = pxVar4->builtInType;
      if (iVar1 == 0x2d) {
        return 0;
      }
    } while (pxVar4->type != XML_SCHEMA_TYPE_BASIC);
    if ((iVar1 == 1) || (iVar1 == 0x2e)) {
      uVar3 = 0x1000000;
    }
    else if (iVar1 == 2) {
      uVar3 = 0x2000000;
    }
    else {
      uVar3 = 0x4000000;
    }
    uVar3 = uVar3 | type->flags;
  }
  else {
    uVar3 = uVar3 | 0x4000000;
  }
  type->flags = uVar3;
  return 0;
}

Assistant:

static int
xmlSchemaTypeFixupWhitespace(xmlSchemaTypePtr type)
{


    /*
    * Evaluate the whitespace-facet value.
    */
    if (WXS_IS_LIST(type)) {
	type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
	return (0);
    } else if (WXS_IS_UNION(type))
	return (0);

    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr lin;

	for (lin = type->facetSet; lin != NULL; lin = lin->next) {
	    if (lin->facet->type == XML_SCHEMA_FACET_WHITESPACE) {
		switch (lin->facet->whitespace) {
		case XML_SCHEMAS_FACET_PRESERVE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE;
		    break;
		case XML_SCHEMAS_FACET_REPLACE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_REPLACE;
		    break;
		case XML_SCHEMAS_FACET_COLLAPSE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
		    break;
		default:
		    return (-1);
		}
		return (0);
	    }
	}
    }
    /*
    * For all `atomic` datatypes other than string (and types `derived`
    * by `restriction` from it) the value of whiteSpace is fixed to
    * collapse
    */
    {
	xmlSchemaTypePtr anc;

	for (anc = type->baseType; anc != NULL &&
		anc->builtInType != XML_SCHEMAS_ANYTYPE;
		anc = anc->baseType) {

	    if (anc->type == XML_SCHEMA_TYPE_BASIC) {
		if (anc->builtInType == XML_SCHEMAS_NORMSTRING) {
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_REPLACE;

		} else if ((anc->builtInType == XML_SCHEMAS_STRING) ||
		    (anc->builtInType == XML_SCHEMAS_ANYSIMPLETYPE)) {
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE;

		} else
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
		break;
	    }
	}
    }
    return (0);
}